

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exceptions.h
# Opt level: O1

void __thiscall FIX::RepeatedTag::RepeatedTag(RepeatedTag *this,int field,string *what)

{
  string local_48;
  
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,"Repeated tag not part of repeating group","");
  FIX::Exception::Exception(&this->super_Exception,&local_48,what);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  *(undefined ***)&this->super_Exception = &PTR__Exception_001f87d8;
  this->field = field;
  return;
}

Assistant:

RepeatedTag(int field = 0, const std::string &what = "")
      : Exception("Repeated tag not part of repeating group", what),
        field(field) {}